

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O0

deUint32 deMemoryHash(void *ptr,size_t numBytes)

{
  deUint32 local_24;
  byte *pbStack_20;
  deUint32 hash;
  deUint8 *input;
  size_t numBytes_local;
  void *ptr_local;
  
  local_24 = 0x1505;
  pbStack_20 = (byte *)ptr;
  input = (deUint8 *)numBytes;
  while (input != (deUint8 *)0x0) {
    local_24 = local_24 * 0x21 + (uint)*pbStack_20;
    pbStack_20 = pbStack_20 + 1;
    input = input + -1;
  }
  return local_24;
}

Assistant:

deUint32 deMemoryHash (const void* ptr, size_t numBytes)
{
	/* \todo [2010-05-10 pyry] Better generic hash function? */
	const deUint8*	input	= (const deUint8*)ptr;
	deUint32		hash	= 5381;

	DE_ASSERT(ptr);
	while (numBytes--)
		hash = (hash << 5) + hash + *input++;

	return hash;
}